

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_yydefred(void)

{
  uint local_34;
  uint local_24;
  int local_10;
  int local_c;
  int j;
  int i;
  
  if (rflag == '\0') {
    fprintf((FILE *)output_file,"static ");
  }
  if (*defred == 0) {
    local_24 = 0;
  }
  else {
    local_24 = *defred - 2;
  }
  fprintf((FILE *)output_file,"int %sdefred[] = {%39d,",symbol_prefix,(ulong)local_24);
  local_10 = 10;
  for (local_c = 1; local_c < nstates; local_c = local_c + 1) {
    if (local_10 < 10) {
      local_10 = local_10 + 1;
    }
    else {
      if (rflag == '\0') {
        outline = outline + 1;
      }
      putc(10,(FILE *)output_file);
      local_10 = 1;
    }
    if (defred[local_c] == 0) {
      local_34 = 0;
    }
    else {
      local_34 = defred[local_c] - 2;
    }
    fprintf((FILE *)output_file,"%5d,",(ulong)local_34);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fprintf((FILE *)output_file,"\n};\n");
  return;
}

Assistant:

void output_yydefred()
{
    register int i, j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sdefred[] = {%39d,", symbol_prefix,
	    (defred[0] ? defred[0] - 2 : 0));

    j = 10;
    for (i = 1; i < nstates; i++)
    {
	if (j < 10)
	    ++j;
	else
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}

	fprintf(output_file, "%5d,", (defred[i] ? defred[i] - 2 : 0));
    }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
}